

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O1

RC __thiscall PF_BufferMgr::LinkHead(PF_BufferMgr *this,int slot)

{
  int iVar1;
  PF_BufPageDesc *pPVar2;
  
  iVar1 = this->first;
  pPVar2 = this->bufTable;
  pPVar2[slot].next = iVar1;
  pPVar2[slot].prev = -1;
  if ((long)iVar1 != -1) {
    pPVar2[iVar1].prev = slot;
  }
  this->first = slot;
  if (this->last == -1) {
    this->last = slot;
  }
  return 0;
}

Assistant:

RC PF_BufferMgr::LinkHead(int slot)
{
   // Set next and prev pointers of slot entry
   bufTable[slot].next = first;
   bufTable[slot].prev = INVALID_SLOT;

   // If list isn't empty, point old first back to slot
   if (first != INVALID_SLOT)
      bufTable[first].prev = slot;

   first = slot;

   // if list was empty, set last to slot
   if (last == INVALID_SLOT)
      last = first;

   // Return ok
   return (0);
}